

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O0

uint64_t __thiscall
nivalis::Environment::def_func
          (Environment *this,string *func_name,Expr *expr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *arg_bindings)

{
  initializer_list<nivalis::Expr::ASTNode> __l;
  bool bVar1;
  undefined1 uVar2;
  mapped_type *pmVar3;
  reference this_00;
  pointer ppVar4;
  vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
  *funcs;
  size_type sVar5;
  const_reference pvVar6;
  reference pvVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  string *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  value_type *nd;
  size_t i_1;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> arg_vars;
  AST *ast;
  Expr func_expr;
  UserFunction *func;
  iterator it;
  size_t idx;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffe60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  ulong uVar10;
  key_type *in_stack_fffffffffffffe78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *__lhs_00;
  int in_stack_fffffffffffffeac;
  Expr *in_stack_fffffffffffffeb0;
  string local_130 [32];
  ASTNode local_110;
  ASTNode *local_100;
  undefined8 local_f8;
  unsigned_long *local_f0;
  unsigned_long *local_e8;
  unsigned_long *local_e0;
  unsigned_long *local_d8;
  unsigned_long *local_d0;
  unsigned_long *local_c8;
  ulong local_c0;
  reference local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b0;
  ulong local_a8;
  undefined1 local_99 [33];
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *local_78;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> local_60;
  reference local_48;
  _Self local_40;
  _Self local_38;
  size_type local_30;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_28;
  string *local_18;
  uint64_t local_8;
  
  local_28 = in_RCX;
  local_18 = in_RSI;
  std::__cxx11::string::clear();
  local_30 = 0;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(in_stack_fffffffffffffe38,(key_type *)0x109982);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(in_stack_fffffffffffffe38);
  bVar1 = std::operator==(&local_38,&local_40);
  if (bVar1) {
    sVar5 = std::
            vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
            ::size((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                    *)(in_RDI + 2));
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::operator[](in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    *pmVar3 = sVar5;
    local_30 = sVar5;
    std::
    vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
    ::emplace_back<>((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                      *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    this_00 = std::
              vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
              ::back((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                      *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    std::__cxx11::string::operator=((string *)this_00,local_18);
  }
  else {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                           *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    local_30 = ppVar4->second;
  }
  local_48 = std::
             vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
             ::operator[]((vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                           *)(in_RDI + 2),local_30);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x109a7d);
  __lhs_00 = &local_60;
  Expr::Expr((Expr *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (Expr *)in_stack_fffffffffffffe38);
  Expr::optimize(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac);
  local_78 = &local_60;
  funcs = (vector<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
           *)std::vector<double,_std::allocator<double>_>::size(in_RDI);
  local_99._1_8_ = 0xffffffffffffffff;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_99;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x109ae5);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffe60,CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58)
             ,in_stack_fffffffffffffe50._M_current,
             (allocator_type *)in_stack_fffffffffffffe48._M_current);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x109b13);
  local_a8 = 0;
  while (uVar10 = local_a8,
        sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_28),
        uVar10 < sVar5) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (local_28,local_a8);
    uVar10 = local_a8;
    if (*pvVar6 != 0xffffffffffffffff) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_28,local_a8);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_99 + 9),
                          *pvVar6);
      *pvVar7 = uVar10;
    }
    local_a8 = local_a8 + 1;
  }
  local_b0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  while (this_01 = local_b0,
        pvVar8 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::size
                           (local_78), this_01 < pvVar8) {
    local_b8 = std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::
               operator[](local_78,(size_type)local_b0);
    in_stack_fffffffffffffe5f = OpCode::has_ref(local_b8->opcode);
    if ((((bool)in_stack_fffffffffffffe5f) && (local_b8->opcode != 3)) &&
       (pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_99 + 9),
                            (local_b8->field_1).ref), *pvVar7 != 0xffffffffffffffff)) {
      local_b8->opcode = 3;
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_99 + 9),
                          (local_b8->field_1).ref);
      (local_b8->field_1).ref = *pvVar7;
    }
    if (local_b8->opcode == 0xc) {
      local_c0 = (ulong)(local_b8->field_1).call_info[0];
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 (value_type_conflict *)in_stack_fffffffffffffe38);
    }
    local_b0 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(local_b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  local_c8 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe38);
  local_d0 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe38);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48->deps;
  local_e0 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe38);
  local_e8 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe38);
  _Var9._M_current._7_1_ = in_stack_fffffffffffffe5f;
  _Var9._M_current._0_7_ = in_stack_fffffffffffffe58;
  _Var9 = std::
          unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    (_Var9,in_stack_fffffffffffffe50);
  local_d8 = _Var9._M_current;
  local_f0 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe38);
  __gnu_cxx::operator-
            ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)in_stack_fffffffffffffe38);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (this_01,CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_28);
  local_48->n_args = sVar5;
  Expr::operator=((Expr *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                  (Expr *)in_stack_fffffffffffffe38);
  uVar2 = anon_unknown_0::check_for_cycle(funcs,uVar10);
  if ((bool)uVar2) {
    Expr::ASTNode::ASTNode(&local_110,null);
    local_100 = &local_110;
    local_f8 = 1;
    __l._M_array._7_1_ = in_stack_fffffffffffffe5f;
    __l._M_array._0_7_ = in_stack_fffffffffffffe58;
    __l._M_len = (size_type)this_01;
    std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::operator=
              ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
               _Var9._M_current,__l);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x109ef9);
    std::operator+((char *)__lhs_00,__rhs);
    std::operator+(__lhs,(char *)CONCAT17(uVar2,in_stack_fffffffffffffe40));
    std::__cxx11::string::operator=((string *)(in_RDI + 3),local_130);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffeb0);
    local_8 = 0xffffffffffffffff;
  }
  else {
    local_8 = local_30;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)_Var9._M_current);
  Expr::~Expr((Expr *)0x109fc4);
  return local_8;
}

Assistant:

uint64_t Environment::def_func(const std::string& func_name,
                  const Expr& expr,
                  const std::vector<uint64_t>& arg_bindings) {
    error_msg.clear();
    size_t idx = 0;
    auto it = freg.find(func_name);
    if (it == freg.end()) {
        // New function
        idx = freg[func_name] = funcs.size();
        funcs.emplace_back();
        funcs.back().name = func_name;
    } else {
        idx = it->second;
    }
    UserFunction& func = funcs[idx];
    func.deps.clear();
    Expr func_expr = expr;
    func_expr.optimize(); // Optimize function expression
    auto& ast = func_expr.ast;
    // Invert argument mapping
    std::vector<uint64_t> arg_vars(vars.size(), -1);
    for (size_t i = 0; i < arg_bindings.size(); ++i) {
        if (~arg_bindings[i]) {
            arg_vars[arg_bindings[i]] = i;
        }
    }
    // Sub arguments
    for (size_t i = 0; i < ast.size(); ++i) {
        auto& nd = ast[i];
        if (OpCode::has_ref(nd.opcode) &&
            nd.opcode != OpCode::arg &&
            ~arg_vars[nd.ref]) {
            // Set argument
            nd.opcode = OpCode::arg;
            nd.ref = arg_vars[nd.ref];
        }
        if (nd.opcode == OpCode::call) {
            // Set dependency on other function
            func.deps.push_back(nd.call_info[0]);
        }
    }
    std::sort(func.deps.begin(), func.deps.end());
    func.deps.resize(std::unique(func.deps.begin(), func.deps.end()) - func.deps.begin());
    func.n_args = arg_bindings.size();
    func.expr = std::move(func_expr);

    // Check for recursion
    if (check_for_cycle(funcs, idx)) {
        // Found cycle
        func.expr.ast = { OpCode::null };
        func.deps.clear();
        error_msg = "Cycle found in definition of " + func_name + "(...)\n";
        return -1;
    }
    return idx;
}